

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O2

void __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
::unbind_agent(dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
               *this,agent_ref_t *agent)

{
  _Base_ptr *pp_Var1;
  iterator __position;
  string *__k;
  iterator __position_00;
  agent_t *local_38;
  
  std::mutex::lock(&this->m_lock);
  local_38 = agent->m_obj;
  __position = std::
               _Rb_tree<so_5::agent_t_*,_std::pair<so_5::agent_t_*const,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::agent_data_t>,_std::_Select1st<std::pair<so_5::agent_t_*const,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::agent_data_t>_>,_std::less<so_5::agent_t_*>,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::agent_data_t>_>_>
               ::find(&(this->m_agents)._M_t,&local_38);
  if ((_Rb_tree_header *)__position._M_node != &(this->m_agents)._M_t._M_impl.super__Rb_tree_header)
  {
    if (__position._M_node[1]._M_left == (_Base_ptr)0x0) {
      __k = agent_t::so_coop_name_abi_cxx11_(agent->m_obj);
      __position_00 =
           std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>_>_>
           ::find(&(this->m_cooperations)._M_t,__k);
      if ((_Rb_tree_header *)__position_00._M_node !=
          &(this->m_cooperations)._M_t._M_impl.super__Rb_tree_header) {
        pp_Var1 = &__position_00._M_node[2]._M_parent;
        *pp_Var1 = (_Base_ptr)((long)&(*pp_Var1)[-1]._M_right + 7);
        if (*pp_Var1 == (_Base_ptr)0x0) {
          impl::agent_queue_t::wait_for_emptyness(*(agent_queue_t **)(__position_00._M_node + 2));
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>,std::_Select1st<std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>>>
          ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>,std::_Select1st<std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>>>
                              *)&this->m_cooperations,__position_00);
        }
      }
    }
    else {
      impl::agent_queue_t::wait_for_emptyness((agent_queue_t *)__position._M_node[1]._M_parent);
    }
    std::
    _Rb_tree<so_5::agent_t*,std::pair<so_5::agent_t*const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::agent_data_t>,std::_Select1st<std::pair<so_5::agent_t*const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::agent_data_t>>,std::less<so_5::agent_t*>,std::allocator<std::pair<so_5::agent_t*const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::agent_data_t>>>
    ::erase_abi_cxx11_((_Rb_tree<so_5::agent_t*,std::pair<so_5::agent_t*const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::agent_data_t>,std::_Select1st<std::pair<so_5::agent_t*const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::agent_data_t>>,std::less<so_5::agent_t*>,std::allocator<std::pair<so_5::agent_t*const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,so_5::disp::thread_pool::impl::agent_queue_t,so_5::disp::thread_pool::bind_params_t,so_5::disp::thread_pool::impl::adaptation_t>::agent_data_t>>>
                        *)&this->m_agents,__position);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return;
}

Assistant:

virtual void
		unbind_agent( agent_ref_t agent ) override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				auto it = m_agents.find( agent.get() );
				if( it != m_agents.end() )
					{
						if( it->second.cooperation_fifo() )
							{
								auto it_coop = m_cooperations.find(
										agent->so_coop_name() );
								if( it_coop != m_cooperations.end() &&
										0 == --(it_coop->second.m_agents) )
									{
										// agent_queue object can be destroyed
										// only when it is empty.
										ADAPTATIONS::wait_for_queue_emptyness(
												*(it_coop->second.m_queue) );

										m_cooperations.erase( it_coop );
									}
							}
						else
							// agent_queue object can be destroyed
							// only when it is empty.
							ADAPTATIONS::wait_for_queue_emptyness(
									*(it->second.m_queue) );

						m_agents.erase( it );
					}
			}